

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303DLHC.cpp
# Opt level: O3

bool __thiscall RTIMUGD20HM303DLHC::setGyroCTRL4(RTIMUGD20HM303DLHC *this)

{
  uint uVar1;
  RTIMUSettings *this_00;
  bool bVar2;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_GD20HM303DLHCGyroFsr;
  if ((ulong)uVar1 < 3) {
    this->m_gyroScale = *(RTFLOAT *)(&DAT_001234d0 + (ulong)uVar1 * 4);
    bVar2 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_gyroSlaveAddr,'#',(char)uVar1 << 4,
                               "Failed to set L3GD20H CTRL4");
    return bVar2;
  }
  fprintf(_stderr,"Illegal L3GD20H FSR code %d\n");
  return false;
}

Assistant:

bool RTIMUGD20HM303DLHC::setGyroCTRL4()
{
    unsigned char ctrl4;

    switch (m_settings->m_GD20HM303DLHCGyroFsr) {
    case L3GD20H_FSR_245:
        ctrl4 = 0x00;
        m_gyroScale = (RTFLOAT)0.00875 * RTMATH_DEGREE_TO_RAD;
        break;

    case L3GD20H_FSR_500:
        ctrl4 = 0x10;
        m_gyroScale = (RTFLOAT)0.0175 * RTMATH_DEGREE_TO_RAD;
        break;

    case L3GD20H_FSR_2000:
        ctrl4 = 0x20;
        m_gyroScale = (RTFLOAT)0.07 * RTMATH_DEGREE_TO_RAD;
        break;

    default:
        HAL_ERROR1("Illegal L3GD20H FSR code %d\n", m_settings->m_GD20HM303DLHCGyroFsr);
        return false;
    }

    return m_settings->HALWrite(m_gyroSlaveAddr,  L3GD20H_CTRL4, ctrl4, "Failed to set L3GD20H CTRL4");
}